

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

deBool deSocket_setFlags(deSocket *sock,deUint32 flags)

{
  int iVar1;
  uint local_40;
  uint local_3c;
  int newFlags_1;
  int oldFlags_1;
  int newFlags;
  int oldFlags;
  int mode_1;
  int mode;
  deSocketHandle fd;
  deUint32 flags_local;
  deSocket *sock_local;
  
  mode_1 = sock->handle;
  if (sock->state == DE_SOCKETSTATE_CLOSED) {
    sock_local._4_4_ = 0;
  }
  else {
    oldFlags = (int)((flags & 1) != 0);
    mode = flags;
    _fd = sock;
    iVar1 = setsockopt(mode_1,1,9,&oldFlags,4);
    if (iVar1 == 0) {
      newFlags = (int)((mode & 2U) != 0);
      iVar1 = setsockopt(mode_1,6,1,&newFlags,4);
      if (iVar1 == 0) {
        local_3c = fcntl(mode_1,3,0);
        if ((mode & 4U) == 0) {
          local_3c = local_3c & 0xfffff7ff;
        }
        else {
          local_3c = local_3c | 0x800;
        }
        iVar1 = fcntl(mode_1,4,(ulong)local_3c);
        if (iVar1 == 0) {
          local_40 = fcntl(mode_1,1,0);
          if ((mode & 8U) == 0) {
            local_40 = local_40 & 0xfffffffe;
          }
          else {
            local_40 = local_40 | 1;
          }
          iVar1 = fcntl(mode_1,2,(ulong)local_40);
          if (iVar1 == 0) {
            sock_local._4_4_ = 1;
          }
          else {
            sock_local._4_4_ = 0;
          }
        }
        else {
          sock_local._4_4_ = 0;
        }
      }
      else {
        sock_local._4_4_ = 0;
      }
    }
    else {
      sock_local._4_4_ = 0;
    }
  }
  return sock_local._4_4_;
}

Assistant:

deBool deSocket_setFlags (deSocket* sock, deUint32 flags)
{
	deSocketHandle fd = sock->handle;

	if (sock->state == DE_SOCKETSTATE_CLOSED)
		return DE_FALSE;

	/* Keepalive. */
	{
		int mode = (flags & DE_SOCKET_KEEPALIVE) ? 1 : 0;
		if (setsockopt(fd, SOL_SOCKET, SO_KEEPALIVE, (const char*)&mode, sizeof(mode)) != 0)
			return DE_FALSE;
	}

	/* Nodelay. */
	{
		int mode = (flags & DE_SOCKET_NODELAY) ? 1 : 0;
		if (setsockopt(fd, IPPROTO_TCP, TCP_NODELAY, (const char*)&mode, sizeof(mode)) != 0)
			return DE_FALSE;
	}

	/* Non-blocking. */
	{
#if defined(DE_USE_WINSOCK)
		u_long mode = (flags & DE_SOCKET_NONBLOCKING) ? 1 : 0;
		if (ioctlsocket(fd, FIONBIO, &mode) != 0)
			return DE_FALSE;
#else
		int oldFlags	= fcntl(fd, F_GETFL, 0);
		int newFlags	= (flags & DE_SOCKET_NONBLOCKING) ? (oldFlags | O_NONBLOCK) : (oldFlags & ~O_NONBLOCK);
		if (fcntl(fd, F_SETFL, newFlags) != 0)
			return DE_FALSE;
#endif
	}

	/* Close on exec. */
	{
#if defined(DE_USE_BERKELEY_SOCKETS)
		int oldFlags = fcntl(fd, F_GETFD, 0);
		int newFlags = (flags & DE_SOCKET_CLOSE_ON_EXEC) ? (oldFlags | FD_CLOEXEC) : (oldFlags & ~FD_CLOEXEC);
		if (fcntl(fd, F_SETFD, newFlags) != 0)
			return DE_FALSE;
#endif
	}

	return DE_TRUE;
}